

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

CuePoint * __thiscall mkvparser::Cues::GetFirst(Cues *this)

{
  longlong lVar1;
  CuePoint *pCP;
  CuePoint **pp;
  Cues *this_local;
  
  if ((this->m_cue_points == (CuePoint **)0x0) || (this->m_count == 0)) {
    this_local = (Cues *)0x0;
  }
  else if (this->m_cue_points == (CuePoint **)0x0) {
    this_local = (Cues *)0x0;
  }
  else {
    this_local = (Cues *)*this->m_cue_points;
    if ((this_local == (Cues *)0x0) ||
       (lVar1 = CuePoint::GetTimeCode((CuePoint *)this_local), lVar1 < 0)) {
      this_local = (Cues *)0x0;
    }
  }
  return (CuePoint *)this_local;
}

Assistant:

const CuePoint* Cues::GetFirst() const {
  if (m_cue_points == NULL || m_count == 0)
    return NULL;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL)
    return NULL;

  CuePoint* const pCP = pp[0];
  if (pCP == NULL || pCP->GetTimeCode() < 0)
    return NULL;

  return pCP;
}